

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.cpp
# Opt level: O1

void duckdb::RepeatFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  ulong *puVar1;
  value_type vVar2;
  value_type vVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar9;
  undefined8 uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  UnifiedVectorFormat *pUVar17;
  ulong uVar18;
  VectorType VVar19;
  ValidityMask *in_R8;
  idx_t in_R9;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar20;
  ulong uVar21;
  undefined8 *puVar22;
  UnifiedVectorFormat *pUVar23;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  anon_struct_16_3_d7536bce_for_pointer aVar24;
  string_t sVar25;
  UnifiedVectorFormat ldata;
  undefined8 *local_108;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  unsigned_long local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vVar2 = *vector;
  vVar3 = *vector_00;
  VVar19 = (VectorType)result;
  if (((byte)vVar2 ^ 2) == 0 && ((byte)vVar3 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar19);
    paVar4 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      aVar24 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(vector + 0x20))->pointer,
                          **(long **)(vector_00 + 0x20),in_R8,in_R9);
      paVar4->pointer = aVar24;
      return;
    }
  }
  else {
    pUVar23 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar3 ^ 2) == 0 && vVar2 == (value_type)0x0) {
      lVar5 = *(long *)(vector + 0x20);
      plVar6 = *(long **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar19);
        lVar7 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar23 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          lVar8 = *plVar6;
          lVar16 = 8;
          do {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + lVar16);
            left_02.value._0_8_ = *(undefined8 *)(lVar5 + -8 + lVar16);
            sVar25 = BinaryLambdaWrapper::
                     Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,lVar8,in_R8,in_R9);
            *(long *)(lVar7 + -8 + lVar16) = sVar25.value._0_8_;
            *(long *)(lVar7 + lVar16) = sVar25.value._8_8_;
            lVar16 = lVar16 + 0x10;
            pUVar23 = pUVar23 + -1;
          } while (pUVar23 != (UnifiedVectorFormat *)0x0);
          return;
        }
        if (pUVar23 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        uVar14 = 0;
        pUVar17 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            uVar21 = 0xffffffffffffffff;
          }
          else {
            uVar21 = *(ulong *)(*(long *)(result + 0x28) + uVar14 * 8);
          }
          pUVar12 = pUVar17 + 0x40;
          if (pUVar23 <= pUVar17 + 0x40) {
            pUVar12 = pUVar23;
          }
          pUVar20 = pUVar12;
          if (uVar21 != 0) {
            pUVar20 = pUVar17;
            if (uVar21 == 0xffffffffffffffff) {
              if (pUVar17 < pUVar12) {
                lVar8 = *plVar6;
                uVar21 = (long)pUVar17 << 4 | 8;
                do {
                  left.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar21);
                  left.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar21);
                  sVar25 = BinaryLambdaWrapper::
                           Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left,lVar8,in_R8,in_R9);
                  *(long *)(lVar7 + -8 + uVar21) = sVar25.value._0_8_;
                  *(long *)(lVar7 + uVar21) = sVar25.value._8_8_;
                  pUVar20 = pUVar20 + 1;
                  uVar21 = uVar21 + 0x10;
                } while (pUVar12 != pUVar20);
              }
            }
            else if (pUVar17 < pUVar12) {
              uVar15 = (long)pUVar17 << 4 | 8;
              uVar18 = 0;
              do {
                if ((uVar21 >> (uVar18 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar15);
                  left_00.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar15);
                  sVar25 = BinaryLambdaWrapper::
                           Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_00,*plVar6,in_R8,in_R9);
                  *(long *)(lVar7 + -8 + uVar15) = sVar25.value._0_8_;
                  *(long *)(lVar7 + uVar15) = sVar25.value._8_8_;
                }
                uVar18 = uVar18 + 1;
                uVar15 = uVar15 + 0x10;
              } while (pUVar17 + (uVar18 - (long)pUVar12) != (UnifiedVectorFormat *)0x0);
              pUVar20 = pUVar17 + uVar18;
            }
          }
          uVar14 = uVar14 + 1;
          pUVar17 = pUVar20;
        } while (uVar14 != (ulong)(pUVar23 + 0x3f) >> 6);
        return;
      }
    }
    else {
      if (((byte)vVar2 ^ 2) != 0 || vVar3 != (value_type)0x0) {
        if (vVar3 == (value_type)0x0 && vVar2 == (value_type)0x0) {
          lVar5 = *(long *)(vector + 0x20);
          lVar7 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar19);
          lVar8 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            if (pUVar23 != (UnifiedVectorFormat *)0x0) {
              lVar16 = 0;
              do {
                sVar25.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + 8 + lVar16 * 2);
                sVar25.value._0_8_ = *(undefined8 *)(lVar5 + lVar16 * 2);
                sVar25 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,sVar25,*(long *)(lVar7 + lVar16)
                                    ,in_R8,in_R9);
                *(long *)(lVar8 + lVar16 * 2) = sVar25.value._0_8_;
                *(long *)(lVar8 + 8 + lVar16 * 2) = sVar25.value._8_8_;
                lVar16 = lVar16 + 8;
                pUVar23 = pUVar23 + -1;
              } while (pUVar23 != (UnifiedVectorFormat *)0x0);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < pUVar23 + 0x3f) {
            uVar14 = 0;
            pUVar17 = (UnifiedVectorFormat *)0x0;
            do {
              lVar16 = *(long *)(result + 0x28);
              if (lVar16 == 0) {
                uVar21 = 0xffffffffffffffff;
              }
              else {
                uVar21 = *(ulong *)(lVar16 + uVar14 * 8);
              }
              pUVar12 = pUVar17 + 0x40;
              if (pUVar23 <= pUVar17 + 0x40) {
                pUVar12 = pUVar23;
              }
              pUVar20 = pUVar12;
              if (uVar21 != 0) {
                pUVar20 = pUVar17;
                if (uVar21 == 0xffffffffffffffff) {
                  if (pUVar17 < pUVar12) {
                    lVar16 = (long)pUVar17 * 2 + 1;
                    do {
                      left_03.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + lVar16 * 8);
                      left_03.value._0_8_ = *(undefined8 *)(lVar5 + -8 + lVar16 * 8);
                      sVar25 = BinaryLambdaWrapper::
                               Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_03,
                                          *(long *)(lVar7 + (long)pUVar17 * 8),in_R8,in_R9);
                      *(long *)(lVar8 + -8 + lVar16 * 8) = sVar25.value._0_8_;
                      *(long *)(lVar8 + lVar16 * 8) = sVar25.value._8_8_;
                      pUVar17 = pUVar17 + 1;
                      lVar16 = lVar16 + 2;
                      pUVar20 = pUVar17;
                    } while (pUVar12 != pUVar17);
                  }
                }
                else if (pUVar17 < pUVar12) {
                  lVar16 = (long)pUVar17 * 2 + 1;
                  uVar15 = 0;
                  do {
                    if ((uVar21 >> (uVar15 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + lVar16 * 8);
                      left_04.value._0_8_ = *(undefined8 *)(lVar5 + -8 + lVar16 * 8);
                      sVar25 = BinaryLambdaWrapper::
                               Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_04,
                                          *(long *)(lVar7 + (long)pUVar17 * 8 + uVar15 * 8),in_R8,
                                          in_R9);
                      *(long *)(lVar8 + -8 + lVar16 * 8) = sVar25.value._0_8_;
                      *(long *)(lVar8 + lVar16 * 8) = sVar25.value._8_8_;
                    }
                    uVar15 = uVar15 + 1;
                    lVar16 = lVar16 + 2;
                  } while (pUVar17 + (uVar15 - (long)pUVar12) != (UnifiedVectorFormat *)0x0);
                  pUVar20 = pUVar17 + uVar15;
                }
              }
              uVar14 = uVar14 + 1;
              pUVar17 = pUVar20;
            } while (uVar14 != (ulong)(pUVar23 + 0x3f) >> 6);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar23);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar23);
          duckdb::Vector::SetVectorType(VVar19);
          lVar5 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            if (pUVar23 != (UnifiedVectorFormat *)0x0) {
              lVar7 = *local_78;
              lVar8 = *local_c0;
              puVar22 = (undefined8 *)(lVar5 + 8);
              pUVar17 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar12 = pUVar17;
                if (lVar7 != 0) {
                  pUVar12 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar17 * 4);
                }
                pUVar20 = pUVar17;
                if (lVar8 != 0) {
                  pUVar20 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar8 + (long)pUVar17 * 4);
                }
                left_01.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar12 * 0x10);
                left_01.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar12 * 0x10);
                sVar25 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_01,
                                    *(long *)(local_b8 + (long)pUVar20 * 8),in_R8,in_R9);
                puVar22[-1] = sVar25.value._0_8_;
                *puVar22 = sVar25.value._8_8_;
                pUVar17 = pUVar17 + 1;
                puVar22 = puVar22 + 2;
              } while (pUVar23 != pUVar17);
            }
          }
          else if (pUVar23 != (UnifiedVectorFormat *)0x0) {
            lVar7 = *local_78;
            lVar8 = *local_c0;
            puVar22 = (undefined8 *)(lVar5 + 8);
            pUVar17 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar12 = pUVar17;
              if (lVar7 != 0) {
                pUVar12 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar17 * 4);
              }
              pUVar20 = pUVar17;
              if (lVar8 != 0) {
                pUVar20 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar8 + (long)pUVar17 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar12 >> 6) * 8) >> ((ulong)pUVar12 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar20 >> 6) * 8) >> ((ulong)pUVar20 & 0x3f) & 1)
                   != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar12 * 0x10);
                left_05.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar12 * 0x10);
                sVar25 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,
                                    *(long *)(local_b8 + (long)pUVar20 * 8),in_R8,in_R9);
                puVar22[-1] = sVar25.value._0_8_;
                *puVar22 = sVar25.value._8_8_;
              }
              else {
                if (*(long *)(result + 0x28) == 0) {
                  local_c8 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var11 = p_Stack_d0;
                  uVar10 = local_d8;
                  local_d8 = 0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(undefined8 *)(result + 0x30) = uVar10;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var11;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  *(unsigned_long **)(result + 0x28) =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                }
                bVar9 = (byte)pUVar17 & 0x3f;
                puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar17 >> 6) * 8);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pUVar17 = pUVar17 + 1;
              puVar22 = puVar22 + 2;
            } while (pUVar23 != pUVar17);
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
        }
        return;
      }
      paVar4 = *(anon_union_16_2_67f50693_for_value **)(vector + 0x20);
      lVar5 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar19);
        lVar7 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector_00 + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector_00 + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector_00 + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar23 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          aVar24 = paVar4->pointer;
          local_108 = (undefined8 *)(lVar7 + 8);
          pUVar17 = (UnifiedVectorFormat *)0x0;
          do {
            sVar25 = BinaryLambdaWrapper::
                     Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)aVar24,
                                *(long *)(lVar5 + (long)pUVar17 * 8),in_R8,in_R9);
            local_108[-1] = sVar25.value._0_8_;
            *local_108 = sVar25.value._8_8_;
            pUVar17 = pUVar17 + 1;
            local_108 = local_108 + 2;
          } while (pUVar23 != pUVar17);
          return;
        }
        if (pUVar23 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        lVar7 = lVar7 + 8;
        uVar14 = 0;
        pUVar17 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            uVar21 = 0xffffffffffffffff;
          }
          else {
            uVar21 = *(ulong *)(*(long *)(result + 0x28) + uVar14 * 8);
          }
          pUVar12 = pUVar17 + 0x40;
          if (pUVar23 <= pUVar17 + 0x40) {
            pUVar12 = pUVar23;
          }
          pUVar20 = pUVar12;
          if (uVar21 != 0) {
            pUVar20 = pUVar17;
            if (uVar21 == 0xffffffffffffffff) {
              if (pUVar17 < pUVar12) {
                aVar24 = paVar4->pointer;
                puVar22 = (undefined8 *)((long)pUVar17 * 0x10 + lVar7);
                do {
                  sVar25 = BinaryLambdaWrapper::
                           Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,(string_t)aVar24,
                                      *(long *)(lVar5 + (long)pUVar20 * 8),in_R8,in_R9);
                  puVar22[-1] = sVar25.value._0_8_;
                  *puVar22 = sVar25.value._8_8_;
                  pUVar20 = pUVar20 + 1;
                  puVar22 = puVar22 + 2;
                } while (pUVar12 != pUVar20);
              }
            }
            else if (pUVar17 < pUVar12) {
              puVar22 = (undefined8 *)((long)pUVar17 * 0x10 + lVar7);
              uVar15 = 0;
              do {
                if ((uVar21 >> (uVar15 & 0x3f) & 1) != 0) {
                  sVar25 = BinaryLambdaWrapper::
                           Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,(string_t)paVar4->pointer,
                                      *(long *)(lVar5 + (long)pUVar17 * 8 + uVar15 * 8),in_R8,in_R9)
                  ;
                  puVar22[-1] = sVar25.value._0_8_;
                  *puVar22 = sVar25.value._8_8_;
                }
                uVar15 = uVar15 + 1;
                puVar22 = puVar22 + 2;
              } while (pUVar17 + (uVar15 - (long)pUVar12) != (UnifiedVectorFormat *)0x0);
              pUVar20 = pUVar17 + uVar15;
            }
          }
          uVar14 = uVar14 + 1;
          pUVar17 = pUVar20;
        } while (uVar14 != (ulong)(pUVar23 + 0x3f) >> 6);
        return;
      }
    }
    duckdb::Vector::SetVectorType(VVar19);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void RepeatFunction(DataChunk &args, ExpressionState &, Vector &result) {
	auto &str_vector = args.data[0];
	auto &cnt_vector = args.data[1];

	BinaryExecutor::Execute<string_t, int64_t, string_t>(
	    str_vector, cnt_vector, result, args.size(), [&](string_t str, int64_t cnt) {
		    auto input_str = str.GetData();
		    auto size_str = str.GetSize();
		    idx_t copy_count = cnt <= 0 || size_str == 0 ? 0 : UnsafeNumericCast<idx_t>(cnt);

		    idx_t copy_size;
		    if (TryMultiplyOperator::Operation(size_str, copy_count, copy_size)) {
			    auto result_str = StringVector::EmptyString(result, copy_size);
			    auto result_data = result_str.GetDataWriteable();
			    for (idx_t i = 0; i < copy_count; i++) {
				    memcpy(result_data + i * size_str, input_str, size_str);
			    }
			    result_str.Finalize();
			    return result_str;
		    } else {
			    throw OutOfRangeException(
			        "Cannot create a string of size: '%d' * '%d', the maximum supported string size is: '%d'", size_str,
			        copy_count, string_t::MAX_STRING_SIZE);
		    }
	    });
}